

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void monty_mul_into(MontyContext *mc,mp_int *r,mp_int *x,mp_int *y)

{
  BignumInt *pBVar1;
  mp_int scratch_00;
  undefined1 local_58 [8];
  mp_int reduced;
  mp_int tmp;
  mp_int scratch;
  mp_int *y_local;
  mp_int *x_local;
  mp_int *r_local;
  MontyContext *mc_local;
  
  if (mc->rw < x->nw) {
    __assert_fail("x->nw <= mc->rw",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x5c4,"void monty_mul_into(MontyContext *, mp_int *, mp_int *, mp_int *)");
  }
  if (y->nw <= mc->rw) {
    tmp.w = (BignumInt *)mc->scratch->nw;
    pBVar1 = mc->scratch->w;
    join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&tmp.w,mc->rw << 1);
    mp_mul_into((mp_int *)&reduced.w,x,y);
    scratch_00.w = pBVar1;
    scratch_00.nw = (size_t)tmp.w;
    _local_58 = monty_reduce_internal(mc,(mp_int *)&reduced.w,scratch_00);
    mp_copy_into(r,(mp_int *)local_58);
    mp_clear(mc->scratch);
    return;
  }
  __assert_fail("y->nw <= mc->rw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x5c5,"void monty_mul_into(MontyContext *, mp_int *, mp_int *, mp_int *)");
}

Assistant:

void monty_mul_into(MontyContext *mc, mp_int *r, mp_int *x, mp_int *y)
{
    assert(x->nw <= mc->rw);
    assert(y->nw <= mc->rw);

    mp_int scratch = *mc->scratch;
    mp_int tmp = mp_alloc_from_scratch(&scratch, 2*mc->rw);
    mp_mul_into(&tmp, x, y);
    mp_int reduced = monty_reduce_internal(mc, &tmp, scratch);
    mp_copy_into(r, &reduced);
    mp_clear(mc->scratch);
}